

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

bool anon_unknown.dwarf_354e9::cmRemoveDirectory(string *dir,bool recursive)

{
  bool bVar1;
  ostream *poVar2;
  Status local_2c;
  Status local_24;
  byte local_19;
  string *psStack_18;
  bool recursive_local;
  string *dir_local;
  
  local_19 = recursive;
  psStack_18 = dir;
  bVar1 = cmsys::SystemTools::FileIsSymlink(dir);
  if (bVar1) {
    local_24 = cmsys::SystemTools::RemoveFile(psStack_18);
    bVar1 = cmsys::Status::operator_cast_to_bool(&local_24);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error removing directory symlink \"");
      poVar2 = std::operator<<(poVar2,(string *)psStack_18);
      std::operator<<(poVar2,"\".\n");
      return false;
    }
  }
  else {
    if ((local_19 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error removing directory \"");
      poVar2 = std::operator<<(poVar2,(string *)psStack_18);
      std::operator<<(poVar2,"\" without recursive option.\n");
      return false;
    }
    local_2c = cmsys::SystemTools::RemoveADirectory(psStack_18);
    bVar1 = cmsys::Status::operator_cast_to_bool(&local_2c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error removing directory \"");
      poVar2 = std::operator<<(poVar2,(string *)psStack_18);
      std::operator<<(poVar2,"\".\n");
      return false;
    }
  }
  return true;
}

Assistant:

bool cmRemoveDirectory(const std::string& dir, bool recursive = true)
{
  if (cmSystemTools::FileIsSymlink(dir)) {
    if (!cmSystemTools::RemoveFile(dir)) {
      std::cerr << "Error removing directory symlink \"" << dir << "\".\n";
      return false;
    }
  } else if (!recursive) {
    std::cerr << "Error removing directory \"" << dir
              << "\" without recursive option.\n";
    return false;
  } else if (!cmSystemTools::RemoveADirectory(dir)) {
    std::cerr << "Error removing directory \"" << dir << "\".\n";
    return false;
  }
  return true;
}